

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::typeParametersCheck
          (TParseContext *this,TSourceLoc *loc,TPublicType *publicType)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  uint uVar1;
  TBasicType TVar2;
  TTypeParameters *pTVar3;
  TVector<glslang::TArraySize> *pTVar4;
  char *pcVar5;
  int iVar6;
  TArraySizes *this_00;
  uint32_t numDims;
  ulong uVar7;
  
  if ((this->super_TParseContextBase).parsingBuiltins == false) {
    if ((publicType->field_0xb9 & 0x20) != 0) {
      pTVar3 = publicType->typeParameters;
      if (pTVar3 == (TTypeParameters *)0x0) {
        pcVar5 = "coopmat missing type parameters";
        goto LAB_00422465;
      }
      TVar2 = pTVar3->basicType;
      if ((EbtSpirvType < TVar2) || ((0x40003faU >> (TVar2 & (EbtNumTypes|EbtFloat16)) & 1) == 0)) {
        pcVar5 = TType::getBasicString(TVar2);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"coopmat invalid basic type",pcVar5,"");
        pTVar3 = publicType->typeParameters;
      }
      pTVar4 = (pTVar3->arraySizes->sizes).sizes;
      pcVar5 = "coopmat incorrect number of type parameters";
      if ((pTVar4 == (TVector<glslang::TArraySize> *)0x0) ||
         (((long)(pTVar4->
                 super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
                 super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(pTVar4->
                 super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
                 super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                 ._M_impl.super__Vector_impl_data._M_start & 0xffffffff0U) != 0x40))
      goto LAB_00422465;
      uVar1 = TSmallArrayVector::getDimSize(&pTVar3->arraySizes->sizes,3);
      if (2 < uVar1) {
        pcVar5 = "coopmat invalid matrix Use";
        goto LAB_00422465;
      }
    }
    TVar2 = publicType->basicType;
    if (TVar2 == EbtTensorLayoutNV) {
      if (publicType->typeParameters == (TTypeParameters *)0x0) {
        pcVar5 = "tensorLayout missing type parameters";
        goto LAB_00422465;
      }
      this_00 = publicType->typeParameters->arraySizes;
      pTVar4 = (this_00->sizes).sizes;
      if (pTVar4 != (TVector<glslang::TArraySize> *)0x0) {
        iVar6 = (int)((ulong)((long)(pTVar4->
                                    super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                    ).
                                    super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pTVar4->
                                   super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                   ).
                                   super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4);
        if (2 < iVar6) {
          pcVar5 = "tensorLayout incorrect number of type parameters";
          goto LAB_00422465;
        }
        if (iVar6 == 2) {
          return;
        }
      }
      while ((pTVar4 == (TVector<glslang::TArraySize> *)0x0 ||
             ((int)((ulong)((long)(pTVar4->
                                  super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                  ).
                                  super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pTVar4->
                                 super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ).
                                 super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) < 2))) {
        TArraySizes::addInnerSize(this_00,0);
        this_00 = publicType->typeParameters->arraySizes;
        pTVar4 = (this_00->sizes).sizes;
      }
      TVar2 = publicType->basicType;
    }
    if (TVar2 == EbtTensorViewNV) {
      if (publicType->typeParameters == (TTypeParameters *)0x0) {
        pcVar5 = "tensorView missing type parameters";
      }
      else {
        pTVar4 = (publicType->typeParameters->arraySizes->sizes).sizes;
        pcVar5 = "tensorView incorrect number of type parameters";
        if (pTVar4 != (TVector<glslang::TArraySize> *)0x0) {
          uVar7 = (ulong)((long)(pTVar4->
                                super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ).
                                super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pTVar4->
                               super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                               ).
                               super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4;
          if (0xfffffff8 < (int)uVar7 - 8U) {
            if ((int)uVar7 == 7) {
              return;
            }
            while (uVar1 = (uint)uVar7, uVar1 < 7) {
              iVar6 = uVar1 - 2;
              if (uVar1 == 1) {
                iVar6 = 0;
              }
              TArraySizes::addInnerSize(publicType->typeParameters->arraySizes,iVar6);
              uVar7 = (ulong)(uVar1 + 1);
            }
            return;
          }
        }
      }
LAB_00422465:
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar5,"","",UNRECOVERED_JUMPTABLE);
      return;
    }
  }
  return;
}

Assistant:

void TParseContext::typeParametersCheck(const TSourceLoc& loc, const TPublicType& publicType)
{
    if (parsingBuiltins)
        return;
    if (publicType.isCoopmatKHR()) {
        if (publicType.typeParameters == nullptr) {
            error(loc, "coopmat missing type parameters", "", "");
            return;
        }
        switch (publicType.typeParameters->basicType) {
        case EbtFloat:
        case EbtFloat16:
        case EbtInt:
        case EbtInt8:
        case EbtInt16:
        case EbtUint:
        case EbtUint8:
        case EbtUint16:
        case EbtSpirvType:
            break;
        default:
            error(loc, "coopmat invalid basic type", TType::getBasicString(publicType.typeParameters->basicType), "");
            break;
        }
        if (publicType.typeParameters->arraySizes->getNumDims() != 4) {
            error(loc, "coopmat incorrect number of type parameters", "", "");
            return;
        }
        int use = publicType.typeParameters->arraySizes->getDimSize(3);
        if (use < 0 || use > 2) {
            error(loc, "coopmat invalid matrix Use", "", "");
            return;
        }
    }
    if (publicType.isTensorLayoutNV()) {
        if (publicType.typeParameters == nullptr) {
            error(loc, "tensorLayout missing type parameters", "", "");
            return;
        }
        if (publicType.typeParameters->arraySizes->getNumDims() > 2) {
            error(loc, "tensorLayout incorrect number of type parameters", "", "");
            return;
        }
        if (publicType.typeParameters && publicType.typeParameters->arraySizes->getNumDims() < 2) {
            while (publicType.typeParameters->arraySizes->getNumDims() < 2) {
                publicType.typeParameters->arraySizes->addInnerSize(0);
            }
        }
    }
    if (publicType.isTensorViewNV()) {
        if (publicType.typeParameters == nullptr) {
            error(loc, "tensorView missing type parameters", "", "");
            return;
        }
        if (publicType.typeParameters->arraySizes->getNumDims() < 1 ||
            publicType.typeParameters->arraySizes->getNumDims() > 7) {
            error(loc, "tensorView incorrect number of type parameters", "", "");
            return;
        }
        if (publicType.typeParameters && publicType.typeParameters->arraySizes->getNumDims() < 7) {
            uint32_t numDims = publicType.typeParameters->arraySizes->getNumDims();
            while (numDims < 7) {
                uint32_t dim = (numDims == 1) ? 0 : (numDims - 2);
                publicType.typeParameters->arraySizes->addInnerSize(dim);
                numDims++;
            }
        }
    }
}